

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

bool Imath_3_2::extractAndRemoveScalingAndShear<float>
               (Matrix44<float> *mat,Vec3<float> *scl,Vec3<float> *shr,bool exc)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  bool bVar5;
  Vec3<float> *pVVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  float fVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  Vec3<float> local_58;
  Vec3<float> VStack_4c;
  Vec3<float> VStack_40;
  float local_34;
  
  pVVar6 = &local_58;
  fVar15 = mat->x[0][0];
  fVar14 = mat->x[0][1];
  uVar4 = *(undefined8 *)(mat->x[1] + 1);
  local_58.x = *(float *)((long)(mat->x + 0) + 0);
  local_58.y = *(float *)((long)(mat->x + 0) + 4);
  local_58.z = mat->x[0][2];
  VStack_4c.x = mat->x[1][0];
  VStack_4c.y = (float)uVar4;
  VStack_4c.z = (float)((ulong)uVar4 >> 0x20);
  VStack_40.x = *(float *)((long)(mat->x + 2) + 0);
  VStack_40.y = *(float *)((long)(mat->x + 2) + 4);
  VStack_40.z = mat->x[2][2];
  local_34 = 0.0;
  lVar8 = 0;
  do {
    lVar9 = 0;
    fVar20 = local_34;
    do {
      local_34 = *(float *)((long)pVVar6 + lVar9 * 4);
      if (local_34 <= -local_34) {
        local_34 = -local_34;
      }
      if (local_34 <= fVar20) {
        local_34 = fVar20;
      }
      lVar9 = lVar9 + 1;
      fVar20 = local_34;
    } while (lVar9 != 3);
    lVar8 = lVar8 + 1;
    pVVar6 = (Vec3<float> *)((long)pVVar6 + 0xc);
  } while (lVar8 != 3);
  if ((local_34 != 0.0) || (NAN(local_34))) {
    lVar8 = 0;
    do {
      bVar5 = checkForZeroScaleInRow<float>
                        (&local_34,(Vec3<float> *)((long)&local_58.x + lVar8),exc);
      fVar15 = local_34;
      if (!bVar5) {
        return false;
      }
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)((long)&local_58.x + lVar8);
      auVar16._4_4_ = local_34;
      auVar16._0_4_ = local_34;
      auVar16._8_8_ = 0;
      auVar11 = divps(auVar11,auVar16);
      *(long *)((long)&local_58.x + lVar8) = auVar11._0_8_;
      *(float *)((long)&local_58.z + lVar8) = *(float *)((long)&local_58.z + lVar8) / fVar15;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x24);
    fVar15 = local_58.x;
    fVar14 = local_58.y;
  }
  fVar15 = local_58.z * local_58.z + fVar15 * fVar15 + fVar14 * fVar14;
  if (fVar15 < 2.3509887e-38) {
    fVar15 = Vec3<float>::lengthTiny(&local_58);
  }
  else {
    fVar15 = SQRT(fVar15);
  }
  scl->x = fVar15;
  bVar5 = checkForZeroScaleInRow<float>(&scl->x,&local_58,exc);
  if (bVar5) {
    fVar15 = scl->x;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_58.x;
    auVar17._4_4_ = local_58.y;
    auVar12._4_4_ = fVar15;
    auVar12._0_4_ = fVar15;
    auVar12._8_4_ = fVar15;
    auVar12._12_4_ = fVar15;
    auVar11 = divps(auVar17,auVar12);
    local_58._0_8_ = auVar11._0_8_;
    local_58.z = local_58.z / fVar15;
    fVar15 = local_58.z * VStack_4c.z + auVar11._0_4_ * VStack_4c.x + auVar11._4_4_ * VStack_4c.y;
    shr->x = fVar15;
    VStack_4c.x = VStack_4c.x - fVar15 * auVar11._0_4_;
    VStack_4c.y = VStack_4c.y - fVar15 * auVar11._4_4_;
    VStack_4c.z = VStack_4c.z - local_58.z * fVar15;
    fVar15 = VStack_4c.z * VStack_4c.z + VStack_4c.x * VStack_4c.x + VStack_4c.y * VStack_4c.y;
    if (fVar15 < 2.3509887e-38) {
      fVar15 = Vec3<float>::lengthTiny(&VStack_4c);
    }
    else {
      fVar15 = SQRT(fVar15);
    }
    scl->y = fVar15;
    bVar5 = checkForZeroScaleInRow<float>(&scl->y,&VStack_4c,exc);
    if (bVar5) {
      fVar15 = scl->y;
      auVar18._4_4_ = VStack_4c.y;
      auVar18._0_4_ = VStack_4c.x;
      auVar18._8_8_ = 0;
      auVar13._4_4_ = fVar15;
      auVar13._0_4_ = fVar15;
      auVar13._8_4_ = fVar15;
      auVar13._12_4_ = fVar15;
      auVar11 = divps(auVar18,auVar13);
      VStack_4c.x = auVar11._0_4_;
      VStack_4c.y = auVar11._4_4_;
      VStack_4c.z = VStack_4c.z / fVar15;
      shr->x = shr->x / fVar15;
      fVar20 = local_58.z * VStack_40.z + local_58.x * VStack_40.x + local_58.y * VStack_40.y;
      shr->y = fVar20;
      fVar15 = VStack_40.x - fVar20 * local_58.x;
      fVar14 = VStack_40.y - fVar20 * local_58.y;
      VStack_40.z = VStack_40.z - local_58.z * fVar20;
      fVar20 = VStack_4c.z * VStack_40.z + VStack_4c.x * fVar15 + VStack_4c.y * fVar14;
      shr->z = fVar20;
      fVar15 = fVar15 - fVar20 * VStack_4c.x;
      fVar14 = fVar14 - fVar20 * VStack_4c.y;
      VStack_40._0_8_ = CONCAT44(fVar14,fVar15);
      VStack_40.z = VStack_40.z - VStack_4c.z * fVar20;
      fVar15 = VStack_40.z * VStack_40.z + fVar15 * fVar15 + fVar14 * fVar14;
      if (fVar15 < 2.3509887e-38) {
        fVar15 = Vec3<float>::lengthTiny(&VStack_40);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      pfVar7 = &scl->z;
      scl->z = fVar15;
      bVar5 = checkForZeroScaleInRow<float>(pfVar7,&VStack_40,exc);
      if (bVar5) {
        fVar15 = *pfVar7;
        auVar10._8_8_ = 0;
        auVar10._0_4_ = VStack_40.x;
        auVar10._4_4_ = VStack_40.y;
        auVar19._4_4_ = fVar15;
        auVar19._0_4_ = fVar15;
        auVar19._8_4_ = fVar15;
        auVar19._12_4_ = fVar15;
        auVar11 = divps(auVar10,auVar19);
        VStack_40.x = (float)auVar11._0_8_;
        VStack_40.y = SUB84(auVar11._0_8_,4);
        VStack_40.z = VStack_40.z / fVar15;
        shr->y = shr->y / fVar15;
        shr->z = shr->z / *pfVar7;
        if ((auVar11._4_4_ * VStack_4c.x - auVar11._0_4_ * VStack_4c.y) * local_58.z +
            (VStack_4c.y * VStack_40.z - auVar11._4_4_ * VStack_4c.z) * local_58.x +
            (VStack_4c.z * auVar11._0_4_ - VStack_40.z * VStack_4c.x) * local_58.y < 0.0) {
          pfVar7 = &local_58.z;
          lVar8 = 0;
          do {
            (&scl->x)[lVar8] = -(&scl->x)[lVar8];
            uVar2._0_4_ = ((Vec3<float> *)(pfVar7 + -2))->x;
            uVar2._4_4_ = ((Vec3<float> *)(pfVar7 + -2))->y;
            ((Vec3<float> *)(pfVar7 + -2))->x = (float)(int)(uVar2 ^ 0x8000000080000000);
            ((Vec3<float> *)(pfVar7 + -2))->y = (float)(int)((uVar2 ^ 0x8000000080000000) >> 0x20);
            *pfVar7 = -*pfVar7;
            lVar8 = lVar8 + 1;
            pfVar7 = pfVar7 + 3;
          } while (lVar8 != 3);
        }
        pfVar7 = &local_58.z;
        lVar8 = 8;
        do {
          *(undefined8 *)((long)(mat->x + -1) + 8 + lVar8) = *(undefined8 *)(pfVar7 + -2);
          *(float *)((long)mat->x[0] + lVar8) = *pfVar7;
          pfVar7 = pfVar7 + 3;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x38);
        uVar1 = scl->x;
        uVar3 = scl->y;
        scl->x = local_34 * (float)uVar1;
        scl->y = local_34 * (float)uVar3;
        scl->z = local_34 * scl->z;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
extractAndRemoveScalingAndShear (
    Matrix44<T>& mat, Vec3<T>& scl, Vec3<T>& shr, bool exc)
{
    //
    // This implementation follows the technique described in the paper by
    // Spencer W. Thomas in the Graphics Gems II article: "Decomposing a
    // Matrix into Simple Transformations", p. 320.
    //

    Vec3<T> row[3];

    row[0] = Vec3<T> (mat[0][0], mat[0][1], mat[0][2]);
    row[1] = Vec3<T> (mat[1][0], mat[1][1], mat[1][2]);
    row[2] = Vec3<T> (mat[2][0], mat[2][1], mat[2][2]);

    T maxVal = 0;
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            if (IMATH_INTERNAL_NAMESPACE::abs (row[i][j]) > maxVal)
                maxVal = IMATH_INTERNAL_NAMESPACE::abs (row[i][j]);

    //
    // We normalize the 3x3 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 3x3 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the
    // scaling factors by maxVal at the end (shear and rotation are not
    // affected by the normalization).

    if (maxVal != 0)
    {
        for (int i = 0; i < 3; i++)
            if (!checkForZeroScaleInRow (maxVal, row[i], exc))
                return false;
            else
                row[i] /= maxVal;
    }

    // Compute X scale factor.
    scl.x = row[0].length ();
    if (!checkForZeroScaleInRow (scl.x, row[0], exc)) return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 6 combinations (XY, XZ, YZ, YX, ZX, ZY), although we only
    // extract the first 3 because we can effect the last 3 by shearing in
    // XY, XZ, YZ combined rotations and scales.
    //
    // shear matrix <   1,  YX,  ZX,  0,
    //                 XY,   1,  ZY,  0,
    //                 XZ,  YZ,   1,  0,
    //                  0,   0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr[0] = row[0].dot (row[1]);
    row[1] -= shr[0] * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (!checkForZeroScaleInRow (scl.y, row[1], exc)) return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y;
    shr[0] /= scl.y;

    // Compute XZ and YZ shears, orthogonalize 3rd row.
    shr[1] = row[0].dot (row[2]);
    row[2] -= shr[1] * row[0];
    shr[2] = row[1].dot (row[2]);
    row[2] -= shr[2] * row[1];

    // Next, get Z scale.
    scl.z = row[2].length ();
    if (!checkForZeroScaleInRow (scl.z, row[2], exc)) return false;

    // Normalize 3rd row and correct the XZ and YZ shear factors for Z scaling.
    row[2] /= scl.z;
    shr[1] /= scl.z;
    shr[2] /= scl.z;

    // At this point, the upper 3x3 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is less than zero, then negate the matrix and the scaling factors.
    if (row[0].dot (row[1].cross (row[2])) < 0)
        for (int i = 0; i < 3; i++)
        {
            scl[i] *= -1;
            row[i] *= -1;
        }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 3x3 matrix in mat is now a rotation matrix.
    for (int i = 0; i < 3; i++)
    {
        mat[i][0] = row[i][0];
        mat[i][1] = row[i][1];
        mat[i][2] = row[i][2];
    }

    // Correct the scaling factors for the normalization step that we
    // performed above; shear and rotation are not affected by the
    // normalization.
    scl *= maxVal;

    return true;
}